

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcIfif.c
# Opt level: O0

void Abc_ObjSortByDelay(Abc_IffMan_t *p,Abc_Obj_t *pObj,int fDelay1,Abc_Obj_t **ppNodes)

{
  float fVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  float fVar4;
  float fVar5;
  Abc_Obj_t *t;
  int local_38;
  int k;
  int a;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t **ppNodes_local;
  int fDelay1_local;
  Abc_Obj_t *pObj_local;
  Abc_IffMan_t *p_local;
  
  t._4_4_ = 0;
  for (k = 0; iVar2 = Abc_ObjFaninNum(pObj), k < iVar2; k = k + 1) {
    pAVar3 = Abc_ObjFanin(pObj,k);
    ppNodes[t._4_4_] = pAVar3;
    iVar2 = Abc_ObjIsCi(pAVar3);
    if (iVar2 == 0) {
      for (local_38 = t._4_4_; 0 < local_38; local_38 = local_38 + -1) {
        fVar4 = Abc_IffDelay(p,ppNodes[local_38 + -1],fDelay1);
        fVar1 = p->pPars->pLutDelays[local_38 + -1];
        fVar5 = Abc_IffDelay(p,ppNodes[local_38],fDelay1);
        if (fVar4 + fVar1 < fVar5 + p->pPars->pLutDelays[local_38]) {
          pAVar3 = ppNodes[local_38 + -1];
          ppNodes[local_38 + -1] = ppNodes[local_38];
          ppNodes[local_38] = pAVar3;
        }
      }
    }
    t._4_4_ = t._4_4_ + 1;
  }
  return;
}

Assistant:

void Abc_ObjSortByDelay( Abc_IffMan_t * p, Abc_Obj_t * pObj, int fDelay1, Abc_Obj_t ** ppNodes )
{
    Abc_Obj_t * pFanin;
    int i, a, k = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        ppNodes[k++] = pFanin;
        if ( Abc_ObjIsCi(pFanin) )
            continue;
        for ( a = k-1; a > 0; a-- )
            if ( Abc_IffDelay(p, ppNodes[a-1], fDelay1) + p->pPars->pLutDelays[a-1] < Abc_IffDelay(p, ppNodes[a], fDelay1) + p->pPars->pLutDelays[a] )
                ABC_SWAP( Abc_Obj_t *, ppNodes[a-1], ppNodes[a] );
    }
/*
    for ( a = 1; a < k; a++ )
    {
        float D1 = Abc_IffDelay(p, ppNodes[a-1], fDelay1);
        float D2 = Abc_IffDelay(p, ppNodes[a], fDelay1);
        if ( Abc_ObjIsCi(ppNodes[a-1]) || Abc_ObjIsCi(ppNodes[a]) )
            continue;
        assert( Abc_IffDelay(p, ppNodes[a-1], fDelay1) + p->pPars->pLutDelays[a-1] >= Abc_IffDelay(p, ppNodes[a], fDelay1) + p->pPars->pLutDelays[a] - 0.01 );
    }
*/
}